

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetPropertyStr(JSContext *ctx,JSValue this_obj,char *prop)

{
  JSAtom prop_00;
  JSValue JVar1;
  
  prop_00 = JS_NewAtom(ctx,prop);
  JVar1 = JS_GetPropertyInternal(ctx,this_obj,prop_00,this_obj,0);
  JS_FreeAtom(ctx,prop_00);
  return JVar1;
}

Assistant:

JSValue JS_GetPropertyStr(JSContext *ctx, JSValueConst this_obj,
                          const char *prop)
{
    JSAtom atom;
    JSValue ret;
    atom = JS_NewAtom(ctx, prop);
    ret = JS_GetProperty(ctx, this_obj, atom);
    JS_FreeAtom(ctx, atom);
    return ret;
}